

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::Primer::Dump(Primer *this,FILE *stream)

{
  size_t sVar1;
  MDDEntry *pMVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  char *pcVar5;
  _Self __tmp;
  char identbuf [128];
  char acStack_b8 [136];
  
  if (this->m_Dict != (Dictionary *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stderr;
    }
    KLVPacket::Dump((KLVPacket *)this,stream,this->m_Dict,false);
    sVar1 = *(size_t *)
             ((long)&(this->LocalTagEntryBatch).
                     super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                     .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                     super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                     ._M_t._M_impl.super__Rb_tree_header + 0x20);
    pcVar5 = "entries";
    if (sVar1 == 1) {
      pcVar5 = "entry";
    }
    fprintf((FILE *)stream,"Primer: %u %s\n",sVar1,pcVar5);
    for (p_Var4 = *(_Base_ptr *)
                   ((long)&(this->LocalTagEntryBatch).
                           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                           .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                           super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                           ._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var4 != &(this->LocalTagEntryBatch).
                   super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                   .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                   super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      pMVar2 = Dictionary::FindULAnyVersion(this->m_Dict,(byte_t *)((long)&p_Var4[1]._M_right + 1));
      pcVar3 = LocalTagEntry::EncodeString((LocalTagEntry *)(p_Var4 + 1),acStack_b8,0x80);
      pcVar5 = "Unknown";
      if (pMVar2 != (MDDEntry *)0x0) {
        pcVar5 = pMVar2->name;
      }
      fprintf((FILE *)stream,"  %s %s\n",pcVar3,pcVar5);
    }
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x24f,"virtual void ASDCP::MXF::Primer::Dump(FILE *)");
}

Assistant:

void
ASDCP::MXF::Primer::Dump(FILE* stream)
{
  assert(m_Dict);
  char identbuf[IdentBufferLen];

  if ( stream == 0 )
    stream = stderr;

  KLVPacket::Dump(stream, *m_Dict, false);
  fprintf(stream, "Primer: %u %s\n",
	  (ui32_t)LocalTagEntryBatch.size(),
	  ( LocalTagEntryBatch.size() == 1 ? "entry" : "entries" ));
  
  Batch<LocalTagEntry>::iterator i = LocalTagEntryBatch.begin();
  for ( ; i != LocalTagEntryBatch.end(); i++ )
    {
      const MDDEntry* Entry = m_Dict->FindULAnyVersion((*i).UL.Value());
      fprintf(stream, "  %s %s\n", (*i).EncodeString(identbuf, IdentBufferLen), (Entry ? Entry->name : "Unknown"));
    }
}